

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UdpEdgeFieldSyntax::setChild
          (UdpEdgeFieldSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00af8dec + *(int *)(&DAT_00af8dec + in_RSI * 4)))();
  return;
}

Assistant:

void UdpEdgeFieldSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: first = child.token(); return;
        case 2: second = child.token(); return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}